

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_readCTable(HUF_CElt *CTable,uint *maxSymbolValuePtr,void *src,size_t srcSize,
                     uint *hasZeroWeights)

{
  U16 UVar1;
  U32 UVar2;
  byte bVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  U32 UVar8;
  BYTE BVar9;
  size_t sStackY_1b0;
  U32 nbSymbols;
  U32 tableLog;
  U16 valPerRank [14];
  U16 nbPerRank [14];
  U32 rankVal [16];
  BYTE huffWeight [256];
  
  tableLog = 0;
  nbSymbols = 0;
  sStackY_1b0 = HUF_readStats(huffWeight,0x100,rankVal,&nbSymbols,&tableLog,src,srcSize);
  if (sStackY_1b0 < 0xffffffffffffff89) {
    *hasZeroWeights = (uint)(rankVal[0] != 0);
    uVar6 = (ulong)tableLog;
    if (uVar6 < 0xd) {
      uVar7 = (ulong)nbSymbols;
      if (*maxSymbolValuePtr + 1 < nbSymbols) {
        sStackY_1b0 = 0xffffffffffffffd0;
      }
      else {
        UVar8 = 0;
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          UVar2 = rankVal[uVar5 + 1];
          bVar3 = (byte)uVar5;
          rankVal[uVar5 + 1] = UVar8;
          UVar8 = (UVar2 << (bVar3 & 0x1f)) + UVar8;
        }
        for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          BVar9 = ((char)tableLog + '\x01') - huffWeight[uVar5];
          if (huffWeight[uVar5] == '\0') {
            BVar9 = '\0';
          }
          CTable[uVar5].nbBits = BVar9;
        }
        nbPerRank[8] = 0;
        nbPerRank[9] = 0;
        nbPerRank[10] = 0;
        nbPerRank[0xb] = 0;
        nbPerRank[0xc] = 0;
        nbPerRank[0xd] = 0;
        nbPerRank[0] = 0;
        nbPerRank[1] = 0;
        nbPerRank[2] = 0;
        nbPerRank[3] = 0;
        nbPerRank[4] = 0;
        nbPerRank[5] = 0;
        nbPerRank[6] = 0;
        nbPerRank[7] = 0;
        valPerRank[8] = 0;
        valPerRank[9] = 0;
        valPerRank[10] = 0;
        valPerRank[0xb] = 0;
        valPerRank[0xc] = 0;
        valPerRank[0xd] = 0;
        valPerRank[0] = 0;
        valPerRank[1] = 0;
        valPerRank[2] = 0;
        valPerRank[3] = 0;
        valPerRank[4] = 0;
        valPerRank[5] = 0;
        valPerRank[6] = 0;
        valPerRank[7] = 0;
        for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          nbPerRank[CTable[uVar5].nbBits] = nbPerRank[CTable[uVar5].nbBits] + 1;
        }
        valPerRank[uVar6 + 1] = 0;
        uVar4 = 0;
        while (uVar6 != 0) {
          valPerRank[uVar6] = uVar4;
          uVar4 = (ushort)(uVar4 + nbPerRank[uVar6]) >> 1;
          uVar6 = uVar6 - 1;
        }
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          UVar1 = valPerRank[CTable[uVar6].nbBits];
          valPerRank[CTable[uVar6].nbBits] = UVar1 + 1;
          CTable[uVar6].val = UVar1;
        }
        *maxSymbolValuePtr = nbSymbols - 1;
      }
    }
    else {
      sStackY_1b0 = 0xffffffffffffffd4;
    }
  }
  return sStackY_1b0;
}

Assistant:

size_t HUF_readCTable (HUF_CElt* CTable, unsigned* maxSymbolValuePtr, const void* src, size_t srcSize, unsigned* hasZeroWeights)
{
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX + 1];   /* init not required, even though some static analyzer may complain */
    U32 rankVal[HUF_TABLELOG_ABSOLUTEMAX + 1];   /* large enough for values from 0 to 16 */
    U32 tableLog = 0;
    U32 nbSymbols = 0;

    /* get symbol weights */
    CHECK_V_F(readSize, HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX+1, rankVal, &nbSymbols, &tableLog, src, srcSize));
    *hasZeroWeights = (rankVal[0] > 0);

    /* check result */
    if (tableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (nbSymbols > *maxSymbolValuePtr+1) return ERROR(maxSymbolValue_tooSmall);

    /* Prepare base value per rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<=tableLog; n++) {
            U32 curr = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = curr;
    }   }

    /* fill nbBits */
    {   U32 n; for (n=0; n<nbSymbols; n++) {
            const U32 w = huffWeight[n];
            CTable[n].nbBits = (BYTE)(tableLog + 1 - w) & -(w != 0);
    }   }

    /* fill val */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+2]  = {0};  /* support w=0=>n=tableLog+1 */
        U16 valPerRank[HUF_TABLELOG_MAX+2] = {0};
        { U32 n; for (n=0; n<nbSymbols; n++) nbPerRank[CTable[n].nbBits]++; }
        /* determine stating value per rank */
        valPerRank[tableLog+1] = 0;   /* for w==0 */
        {   U16 min = 0;
            U32 n; for (n=tableLog; n>0; n--) {  /* start at n=tablelog <-> w=1 */
                valPerRank[n] = min;     /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        /* assign value within rank, symbol order */
        { U32 n; for (n=0; n<nbSymbols; n++) CTable[n].val = valPerRank[CTable[n].nbBits]++; }
    }

    *maxSymbolValuePtr = nbSymbols - 1;
    return readSize;
}